

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Window.cpp
# Opt level: O3

void __thiscall cursespp::Window::Clear(Window *this)

{
  WINDOW **ppWVar1;
  ulong uVar2;
  WINDOW *pWVar3;
  uint uVar4;
  ulong uVar5;
  WINDOW **ppWVar6;
  
  ppWVar1 = &this->content;
  if (this->content != (WINDOW *)0x0) {
    werase();
    wmove(*ppWVar1,0,0);
  }
  uVar4 = (*(this->super_IWindow).super_IOrderable._vptr_IOrderable[0x24])(this);
  uVar5 = (ulong)((uVar4 & 0xff) << 4);
  uVar2 = *(ulong *)((long)&(this->contentColor).value + uVar5);
  pWVar3 = this->frame;
  ppWVar6 = &this->frame;
  if (pWVar3 == (WINDOW *)0x0 || this->content != pWVar3) {
    if (this->content == (WINDOW *)0x0 || pWVar3 == (WINDOW *)0x0) {
      return;
    }
    uVar5 = *(ulong *)((long)&(this->frameColor).value + uVar5);
    wbkgdset(pWVar3,uVar5 & 0xffffffff);
    wbkgd(*ppWVar6,uVar5 & 0xffffffff);
    wbkgdset(*ppWVar1,uVar2 & 0xffffffff);
    ppWVar6 = ppWVar1;
  }
  else {
    wbkgdset(pWVar3,uVar2 & 0xffffffff);
  }
  wbkgd(*ppWVar6,uVar2 & 0xffffffff);
  return;
}

Assistant:

void Window::Clear() {
    ASSERT_MAIN_THREAD();

    if (this->content) {
        werase(this->content);
        wmove(this->content, 0, 0);
    }

    bool focused = this->IsFocused();
    int64_t contentColor = focused ? this->focusedContentColor : this->contentColor;
    int64_t frameColor = focused ? this->focusedFrameColor : this->frameColor;

    if (this->content == this->frame && this->frame) {
        wbkgd_internal(this->frame, contentColor);
    }
    else if (this->frame && this->content) {
        wbkgd_internal(this->frame, frameColor);
        wbkgd_internal(this->content, contentColor);
    }
}